

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O3

void underline(int offset,int left,int right,char *text)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  if (1 < offset) {
    uVar5 = offset + 1;
    do {
      fputc(0x2d,_stderr);
      uVar5 = uVar5 - 1;
    } while (2 < uVar5);
  }
  uVar5 = offset;
  if (0 < left) {
    uVar4 = 0;
    do {
      iVar6 = 1;
      if (text[uVar4] == '\t') {
        uVar3 = uVar5 + 7;
        if (-1 < (int)uVar5) {
          uVar3 = uVar5;
        }
        iVar6 = ((uVar3 & 0xfffffff8) - uVar5) + 8;
      }
      uVar5 = iVar6 + uVar5;
      uVar4 = uVar4 + 1;
    } while ((uint)left != uVar4);
  }
  if (uVar5 - offset != -1) {
    iVar6 = ~uVar5 + offset;
    do {
      fputc(0x20,_stderr);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0);
  }
  uVar3 = uVar5;
  if (left <= right) {
    lVar1 = 0;
    do {
      iVar6 = 1;
      if (text[lVar1 + left] == '\t') {
        uVar2 = uVar3 + 7;
        if (-1 < (int)uVar3) {
          uVar2 = uVar3;
        }
        iVar6 = ((uVar2 & 0xfffffff8) - uVar3) + 8;
      }
      uVar3 = iVar6 + uVar3;
      lVar1 = lVar1 + 1;
    } while ((right - left) + 1 != (int)lVar1);
  }
  if (uVar3 != uVar5) {
    iVar6 = uVar5 - uVar3;
    do {
      fputc(0x5e,_stderr);
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0);
  }
  return;
}

Assistant:

static void underline(int offset, int left, int right, const char *text) {
	auto column = offset;
	while (--offset > 0)
		fputc('-', stderr);
	auto column_ref = column;
	for (auto i = 0; i < left; ++i)
		column += (text[i] == '\t') ? 8 - column % 8 : 1;
	fputnc(' ', column - column_ref + 1, stderr);

	column_ref = column;
	for (auto i = left; i <= right;  ++i)
		column += text[i] == '\t' ? 8 - column % 8 : 1;
	fputnc('^', column - column_ref, stderr);

	// fprintf(stderr, " %d %d %d", offset, left, right);
}